

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioSop.c
# Opt level: O3

Vec_Int_t * Mio_SopCoverAnd(Vec_Int_t *p,Vec_Int_t *q)

{
  uint uVar1;
  Vec_Int_t *p_00;
  int *piVar2;
  int iVar3;
  int iVar4;
  uint c;
  int iVar5;
  long lVar6;
  long lVar7;
  
  iVar5 = p->nSize;
  iVar4 = q->nSize;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar3 = 0x10;
  if (0xe < iVar4 * iVar5 - 1U) {
    iVar3 = iVar4 * iVar5;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar3;
  if (iVar3 == 0) {
    piVar2 = (int *)0x0;
  }
  else {
    piVar2 = (int *)malloc((long)iVar3 << 2);
  }
  p_00->pArray = piVar2;
  if (0 < iVar5) {
    lVar6 = 0;
    do {
      if (0 < iVar4) {
        uVar1 = p->pArray[lVar6];
        lVar7 = 0;
        do {
          c = q->pArray[lVar7] | uVar1;
          if ((c >> 1 & c & 0x55555555) == 0) {
            Mio_SopPushSCC(p_00,c);
            iVar4 = q->nSize;
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < iVar4);
        iVar5 = p->nSize;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < iVar5);
  }
  return p_00;
}

Assistant:

Vec_Int_t * Mio_SopCoverAnd( Vec_Int_t * p, Vec_Int_t * q )
{
    Vec_Int_t * r;
    unsigned EntryP, EntryQ;
    int i, k;
    r = Vec_IntAlloc( Vec_IntSize(p) * Vec_IntSize(q) );
    Vec_IntForEachEntry( p, EntryP, i )
        Vec_IntForEachEntry( q, EntryQ, k )
            if ( !Mio_CubeEmpty( Mio_CubeAnd(EntryP, EntryQ) ) )
                Mio_SopPushSCC( r, Mio_CubeAnd(EntryP, EntryQ) );
    return r;
}